

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void CheckIs(TidyDocImpl *doc,Node *node,AttVal *attval)

{
  bool bVar1;
  char *pcVar2;
  Bool go;
  char *ptr;
  AttVal *attval_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  pcVar2 = strchr(node->element,0x2d);
  if ((pcVar2 != (char *)0x0) && (0 < (long)pcVar2 - (long)node->element)) {
    prvTidyReportAttrError(doc,node,attval,0x227);
  }
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    prvTidyReportAttrError(doc,node,attval,0x256);
  }
  else {
    pcVar2 = strchr(attval->value,0x2d);
    bVar1 = false;
    if (pcVar2 != (char *)0x0) {
      bVar1 = 0 < (long)pcVar2 - (long)attval->value;
    }
    pcVar2 = strchr(attval->value,0x20);
    if (!(bool)(bVar1 & pcVar2 == (char *)0x0)) {
      prvTidyReportAttrError(doc,node,attval,0x22b);
    }
  }
  return;
}

Assistant:

void CheckIs( TidyDocImpl* doc, Node *node, AttVal *attval )
{
    const char *ptr;
    Bool go = yes;

    /* `is` MUST NOT be in an autonomous custom tag */
    ptr = strchr(node->element, '-');
    if ( ( ptr && (ptr - node->element > 0) ) )
    {
        TY_(ReportAttrError)( doc, node, attval, ATTRIBUTE_IS_NOT_ALLOWED);
    }

    /* Even if we fail the above test, we'll continue to emit reports because
       the user should *also* know that his attribute values are wrong, even
       if they should't be in custom tags anyway. */

    /* `is` MUST have a value */
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    /* `is` MUST contain a hyphen and no space. */
    ptr = strchr(attval->value, '-');
    go = ( ptr && (ptr - attval->value > 0) );
    ptr = strchr(attval->value, ' ');
    go = go & (ptr == NULL);
    if ( !go )
    {
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
    }
}